

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O2

void skiwi::inline_ieee754_pi(asmcode *code,compiler_options *param_2)

{
  operation oVar1;
  operand oVar2;
  operation local_48;
  operand local_44;
  operand local_40;
  operand local_3c;
  uint64_t header;
  
  header = 0x100000000000001;
  oVar1 = MOV;
  local_44 = RBP;
  local_48 = oVar1;
  local_40 = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,&local_40,&local_44);
  local_48 = OR;
  local_44 = NUMBER;
  local_3c = CL;
  local_40 = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_48,&local_40,&local_44,(int *)&local_3c);
  oVar2 = RAX;
  local_44 = NUMBER;
  local_48 = oVar1;
  local_40 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,&local_48,&local_40,&local_44,&header);
  local_48 = oVar1;
  local_44 = oVar2;
  local_40 = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,&local_40,&local_44);
  local_48 = FLDPI;
  assembler::asmcode::add<assembler::asmcode::operation>(code,&local_48);
  local_48 = FSTP;
  local_44 = DH;
  local_40 = MEM_RBP;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,&local_48,&local_40,(int *)&local_44);
  local_48 = ADD;
  local_40 = RBP;
  local_44 = NUMBER;
  local_3c = local_40;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_48,&local_40,&local_44,(int *)&local_3c);
  local_48 = MOV;
  local_44 = RBX;
  local_40 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,&local_40,&local_44);
  return;
}

Assistant:

void inline_ieee754_pi(ASM::asmcode& code, const compiler_options&)
  {
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FLDPI);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }